

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  ExampleSOLHandler esolh;
  string stub;
  ExampleNLFeeder nlf;
  string sopts;
  string solver;
  NLUtils utils;
  NLSolver nlsol;
  ExampleModel emdl;
  ExampleSOLHandler local_380;
  string local_378;
  string local_358;
  ExampleNLFeeder local_338;
  string local_328;
  string local_308;
  NLUtils local_2e8;
  NLSolver local_2d8;
  ExampleModel local_210;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,argv[1],(allocator<char> *)&local_210);
    if (argc == 2) {
      pcVar2 = "";
    }
    else {
      pcVar2 = argv[2];
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,pcVar2,(allocator<char> *)&local_210);
    bVar3 = true;
    if (3 < argc) {
      iVar1 = strcmp("text",argv[3]);
      bVar3 = iVar1 != 0;
    }
    if (argc < 5) {
      pcVar2 = "";
    }
    else {
      pcVar2 = argv[4];
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,pcVar2,(allocator<char> *)&local_210);
    ExampleModel::ExampleModel(&local_210);
    local_2e8._vptr_NLUtils = (_func_int **)&PTR__NLUtils_00124c40;
    local_2e8.show_fln_ = false;
    local_380.mdl_ = &local_210;
    local_338.mdl_ = &local_210;
    local_338.binary_ = bVar3;
    mp::NLSolver::NLSolver(&local_2d8,&local_2e8);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,local_378._M_dataplus._M_p,
               local_378._M_dataplus._M_p + local_378._M_string_length);
    mp::NLSolver::SetFileStub(&local_2d8,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    bVar3 = mp::NLSolver::Solve<ExampleNLFeeder,ExampleSOLHandler>
                      (&local_2d8,&local_338,&local_380,&local_308,&local_328);
    if (!bVar3) {
      puts(local_2d8.err_msg_._M_dataplus._M_p);
    }
    else {
      ExampleSOLHandler::PrintSolution(&local_380,&local_378);
    }
    mp::NLSolver::~NLSolver(&local_2d8);
    ExampleModel::~ExampleModel(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    return (uint)!bVar3;
  }
  puts(
      "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
      );
  exit(0);
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  ExampleModel emdl;
  ExampleNLFeeder nlf(emdl, binary);
  ExampleSOLHandler esolh(emdl);
  mp::NLUtils utils;

  mp::NLSolver nlsol(&utils);
  nlsol.SetFileStub(stub);
  if (!nlsol.Solve(nlf, esolh, solver, sopts)) {
    printf("%s\n", nlsol.GetErrorMessage());
    return EXIT_FAILURE;
  } else {
    esolh.PrintSolution(stub);
  }

  return EXIT_SUCCESS;
}